

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_scalar_diff(secp256k1_scalar *diff)

{
  secp256k1_scalar *in_RDI;
  secp256k1_scalar *unaff_retaddr;
  secp256k1_scalar neghalf;
  int i;
  secp256k1_scalar *in_stack_ffffffffffffffd8;
  secp256k1_scalar *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  secp256k1_scalar_half(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  secp256k1_scalar_negate(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI->d[0] = 1;
  in_RDI->d[1] = 0;
  in_RDI->d[2] = 0;
  in_RDI->d[3] = 0;
  for (iVar1 = 0; iVar1 < 0x101; iVar1 = iVar1 + 1) {
    secp256k1_scalar_add
              (unaff_retaddr,in_RDI,(secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  secp256k1_scalar_add
            (unaff_retaddr,in_RDI,(secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

static void secp256k1_ecmult_gen_scalar_diff(secp256k1_scalar* diff) {
    int i;

    /* Compute scalar -1/2. */
    secp256k1_scalar neghalf;
    secp256k1_scalar_half(&neghalf, &secp256k1_scalar_one);
    secp256k1_scalar_negate(&neghalf, &neghalf);

    /* Compute offset = 2^(COMB_BITS - 1). */
    *diff = secp256k1_scalar_one;
    for (i = 0; i < COMB_BITS - 1; ++i) {
        secp256k1_scalar_add(diff, diff, diff);
    }

    /* The result is the sum 2^(COMB_BITS - 1) + (-1/2). */
    secp256k1_scalar_add(diff, diff, &neghalf);
}